

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.c
# Opt level: O3

void init_nhcolors(void)

{
  char *__s;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  nh_bool nVar5;
  int iVar6;
  size_t sVar7;
  FILE *__stream;
  char *pcVar8;
  long lVar9;
  FILE *map;
  long lVar10;
  short *psVar11;
  int colorValue;
  int pos;
  char line [256];
  fnchar filename [256];
  int local_248;
  int local_244;
  FILE *local_240;
  char local_238 [256];
  FILE local_138;
  
  cVar4 = has_colors();
  if (cVar4 != '\0') {
    ui_flags.color = '\x01';
    start_color();
    use_default_colors();
    color_map.fgColors[0] = 0;
    color_map.fgColors[1] = 1;
    color_map.fgColors[2] = 2;
    color_map.fgColors[3] = 3;
    color_map.fgColors[4] = 4;
    color_map.fgColors[5] = 5;
    color_map.fgColors[6] = 6;
    color_map.fgColors[7] = -1;
    color_map.fgColors[8] = 7;
    color_map.fgColors[9] = 9;
    color_map.fgColors[10] = 10;
    color_map.fgColors[0xb] = 0xb;
    color_map.fgColors[0xc] = 0xc;
    color_map.fgColors[0xd] = 0xd;
    color_map.fgColors[0xe] = 0xe;
    color_map.fgColors[0xf] = 0xf;
    color_map.bgColors[0] = 0;
    color_map.bgColors[1] = 1;
    color_map.bgColors[2] = 2;
    color_map.bgColors[3] = 3;
    color_map.bgColors[4] = 4;
    color_map.bgColors[5] = 5;
    color_map.bgColors[6] = 6;
    color_map.bgColors[7] = -1;
    color_map.bgColors[8] = 7;
    color_map.bgColors[9] = 9;
    color_map.bgColors[10] = 10;
    color_map.bgColors[0xb] = 0xb;
    color_map.bgColors[0xc] = 0xc;
    color_map.bgColors[0xd] = 0xd;
    color_map.bgColors[0xe] = 0xe;
    color_map.bgColors[0xf] = 0xf;
    local_138._flags._0_1_ = 0;
    map = (FILE *)0x0;
    nVar5 = get_gamedir(CONFIG_DIR,(char *)&local_138);
    if (nVar5 != '\0') {
      map = &local_138;
      sVar7 = strlen((char *)map);
      *(undefined8 *)((long)&local_138._flags + sVar7) = 0x70616d726f6c6f63;
      *(undefined8 *)(local_138._shortbuf + (sVar7 - 0x7d)) = 0x666e6f632e7061;
      __stream = fopen((char *)map,"r");
      if (__stream != (FILE *)0x0) {
        pcVar8 = fgets(local_238,0x100,__stream);
        if (pcVar8 != (char *)0x0) {
          local_240 = __stream;
          do {
            iVar6 = __isoc99_sscanf(local_238," %n%*s %i",&local_244,&local_248);
            if (iVar6 == 1) {
              lVar9 = (long)local_244;
              cVar4 = local_238[lVar9];
              if (cVar4 != '#') {
                pcVar8 = local_238;
                if (cVar4 == 'b') {
                  if ((local_238[lVar9 + 1] != 'g') || (local_238[lVar9 + 2] != '.'))
                  goto LAB_00108db2;
                  pcVar8 = local_238 + 3;
                  bVar1 = 1;
                  bVar3 = 0;
                  bVar2 = 0;
                }
                else {
                  if (((cVar4 == 'f') && (local_238[lVar9 + 1] == 'g')) &&
                     (local_238[lVar9 + 2] == '.')) {
                    pcVar8 = local_238 + 3;
                    bVar3 = 1;
                    bVar2 = 0;
                  }
                  else {
LAB_00108db2:
                    bVar2 = 1;
                    bVar3 = 0;
                  }
                  bVar1 = 0;
                }
                lVar10 = 0;
                psVar11 = color_map.bgColors;
                do {
                  __s = *(char **)((long)colorNames + lVar10);
                  sVar7 = strlen(__s);
                  iVar6 = strncmp(pcVar8 + lVar9,__s,sVar7);
                  if (iVar6 == 0) {
                    if ((-1 < local_248) && (local_248 < _COLORS)) {
                      if ((bool)(bVar3 | bVar2)) {
                        ((ColorMap *)(psVar11 + -0x10))->fgColors[0] = (short)local_248;
                      }
                      if ((bool)(bVar2 | bVar1)) {
                        *psVar11 = (short)local_248;
                      }
                    }
                    break;
                  }
                  psVar11 = psVar11 + 1;
                  lVar10 = lVar10 + 8;
                } while (lVar10 != 0x80);
              }
            }
            __stream = local_240;
            pcVar8 = fgets(local_238,0x100,local_240);
          } while (pcVar8 != (char *)0x0);
        }
        fclose(__stream);
        map = __stream;
      }
    }
    apply_colormap((ColorMap *)map);
  }
  return;
}

Assistant:

void init_nhcolors(void)
{
    if (!has_colors())
	return;

    ui_flags.color = TRUE;

    start_color();
    use_default_colors();

    read_colormap(&color_map);
    apply_colormap(&color_map);
}